

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

vec3 __thiscall polyscope::SlicePlane::getCenter(SlicePlane *this)

{
  float _y;
  vec3 vVar1;
  bool *pbVar2;
  mat<4,_4,_float,_(glm::qualifier)0> *pmVar3;
  col_type *pcVar4;
  float *pfVar5;
  long in_RDI;
  float fVar6;
  vec3 center;
  vec<3,_float,_(glm::qualifier)0> local_c;
  
  pbVar2 = PersistentValue<bool>::get((PersistentValue<bool> *)(in_RDI + 0x40));
  if ((*pbVar2 & 1U) == 0) {
    fVar6 = std::numeric_limits<float>::infinity();
    glm::vec<3,float,(glm::qualifier)0>::vec<float,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_c,fVar6,0.0,0.0);
  }
  else {
    pmVar3 = PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get
                       ((PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)
                        (in_RDI + 0xb8));
    pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](pmVar3,3);
    pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,0);
    fVar6 = *pfVar5;
    pmVar3 = PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get
                       ((PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)
                        (in_RDI + 0xb8));
    pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](pmVar3,3);
    pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,1);
    _y = *pfVar5;
    pmVar3 = PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get
                       ((PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)
                        (in_RDI + 0xb8));
    pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](pmVar3,3);
    pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,2);
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_c,fVar6,_y,*pfVar5);
  }
  vVar1.field_2 = local_c.field_2;
  vVar1.field_0 = local_c.field_0;
  vVar1.field_1 = local_c.field_1;
  return vVar1;
}

Assistant:

glm::vec3 SlicePlane::getCenter() {
  if (active.get()) {
    glm::vec3 center{objectTransform.get()[3][0], objectTransform.get()[3][1], objectTransform.get()[3][2]};
    return center;
  } else {
    // Put it really far away so tests always pass
    return glm::vec3{std::numeric_limits<float>::infinity(), 0., 0.};
  }
}